

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::prepareAttribLocation
          (TextureTestBase *this,Program *program,ProgramInterface *program_interface)

{
  GLuint index;
  pointer ppVVar1;
  GLint location;
  
  for (ppVVar1 = (program_interface->m_vertex).m_inputs.
                 super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVVar1 !=
      (program_interface->m_vertex).m_inputs.
      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppVVar1 = ppVVar1 + 1) {
    if (((*ppVVar1)->m_descriptor).m_expected_location == -1) {
      index = Utils::Program::GetResourceIndex(program,&((*ppVVar1)->m_descriptor).m_name,0x92e3);
      location = 0;
      Utils::Program::GetResource(program,0x92e3,index,0x930e,1,&location);
      ((*ppVVar1)->m_descriptor).m_expected_location = location;
    }
  }
  return;
}

Assistant:

void TextureTestBase::prepareAttribLocation(Utils::Program& program, Utils::ProgramInterface& program_interface)
{
	Utils::ShaderInterface& si = program_interface.GetShaderInterface(Utils::Shader::VERTEX);

	Utils::Variable::PtrVector& inputs = si.m_inputs;

	for (Utils::Variable::PtrVector::iterator it = inputs.begin(); inputs.end() != it; ++it)
	{
		/* Test does not specify location, query value and set */
		if (Utils::Variable::m_automatic_location == (*it)->m_descriptor.m_expected_location)
		{
			GLuint index	= program.GetResourceIndex((*it)->m_descriptor.m_name, GL_PROGRAM_INPUT);
			GLint  location = 0;

			program.GetResource(GL_PROGRAM_INPUT, index, GL_LOCATION, 1 /* size */, &location);

			(*it)->m_descriptor.m_expected_location = location;
		}
	}
}